

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMovea<(moira::Instr)72,(moira::Mode)1,(moira::Size)2>(Moira *this,u16 opcode)

{
  short sVar1;
  u32 uVar2;
  
  sVar1 = *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  *(int *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x38) = (int)sVar1;
  return;
}

Assistant:

void
Moira::execMovea(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea, data;
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    prefetch<POLLIPL>();
    writeA(dst, SEXT<S>(data));
}